

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutApi.c
# Opt level: O2

void Cut_NodeFreeCuts(Cut_Man_t *p,int Node)

{
  Cut_Cut_t *pCVar1;
  Cut_Cut_t *pCVar2;
  Cut_Cut_t *pCut;
  
  pCVar2 = Cut_NodeReadCutsNew(p,Node);
  if (pCVar2 == (Cut_Cut_t *)0x0) {
    return;
  }
  do {
    pCut = pCVar2;
    pCVar1 = pCVar2->pNext;
    do {
      pCVar2 = pCVar1;
      if (pCut == (Cut_Cut_t *)0x0) {
        Cut_NodeWriteCutsNew(p,Node,(Cut_Cut_t *)0x0);
        return;
      }
      Cut_CutRecycle(p,pCut);
      pCut = pCVar2;
      pCVar1 = (Cut_Cut_t *)0x0;
    } while (pCVar2 == (Cut_Cut_t *)0x0);
  } while( true );
}

Assistant:

void Cut_NodeFreeCuts( Cut_Man_t * p, int Node )
{
    Cut_Cut_t * pList, * pCut, * pCut2;
    pList = Cut_NodeReadCutsNew( p, Node );
    if ( pList == NULL )
        return;
    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
        Cut_CutRecycle( p, pCut );
    Cut_NodeWriteCutsNew( p, Node, NULL );
}